

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Gia_ManSuperCollectXor_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  
  uVar1 = (ulong)pObj & 1;
  while( true ) {
    if (uVar1 != 0) {
      __assert_fail("!Gia_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                    ,0x23e,"void Gia_ManSuperCollectXor_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar1 = *(ulong *)pObj;
    uVar3 = (uint)uVar1;
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) break;
    pGVar2 = p->pObjs;
    if (((uint)(uVar1 >> 0x20) & 0x1fffffff) <= (uVar3 & 0x1fffffff)) goto LAB_007d6ee2;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_007d6f26;
    if ((1 < p->pRefs[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555]) ||
       (100 < p->vSuper->nSize)) goto LAB_007d6ee2;
    if ((uVar1 & 0x2000000020000000) != 0) {
      __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                    ,0x248,"void Gia_ManSuperCollectXor_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)(uVar3 & 0x1fffffff));
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    uVar1 = (ulong)pObj & 1;
  }
  pGVar2 = p->pObjs;
LAB_007d6ee2:
  pGVar5 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  if ((pGVar2 <= pGVar5) && (pGVar5 < pGVar2 + p->nObjs)) {
    iVar4 = (int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2);
    if (-1 < iVar4 * -0x55555555) {
      Vec_IntPush(p->vSuper,iVar4 * 0x55555556);
      return;
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
LAB_007d6f26:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManSuperCollectXor_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fStrict )
{
    assert( !Gia_IsComplement(pObj) );
    if ( !Gia_ObjIsXor(pObj) ||     
        (fStrict && Gia_ObjRefNum(p, pObj) > 1) || 
        Gia_ObjRefNum(p, pObj) > 2 || 
        (Gia_ObjRefNum(p, pObj) == 2 && (Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 || Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1)) || 
        Vec_IntSize(p->vSuper) > 50 )
    {
        Vec_IntPush( p->vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    assert( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) );
    Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin0(pObj), fStrict );
    Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin1(pObj), fStrict );
}